

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPMuxError ChunkAssignData(WebPChunk *chunk,WebPData *data,int copy_data,uint32_t tag)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  int *in_RDI;
  WebPChunk *in_stack_ffffffffffffffd8;
  int local_1c;
  
  if ((in_ECX == 0x58385056) || (local_1c = in_EDX, in_ECX == 0x4d494e41)) {
    local_1c = 1;
  }
  ChunkRelease(in_stack_ffffffffffffffd8);
  if (in_RSI != (undefined8 *)0x0) {
    if (local_1c == 0) {
      *(undefined8 *)(in_RDI + 2) = *in_RSI;
      *(undefined8 *)(in_RDI + 4) = in_RSI[1];
    }
    else {
      iVar1 = WebPDataCopy((WebPData *)in_stack_ffffffffffffffd8,(WebPData *)0x10868e);
      if (iVar1 == 0) {
        return WEBP_MUX_MEMORY_ERROR;
      }
      in_RDI[1] = 1;
    }
  }
  *in_RDI = in_ECX;
  return WEBP_MUX_OK;
}

Assistant:

WebPMuxError ChunkAssignData(WebPChunk* chunk, const WebPData* const data,
                             int copy_data, uint32_t tag) {
  // For internally allocated chunks, always copy data & make it owner of data.
  if (tag == kChunks[IDX_VP8X].tag || tag == kChunks[IDX_ANIM].tag) {
    copy_data = 1;
  }

  ChunkRelease(chunk);

  if (data != NULL) {
    if (copy_data) {        // Copy data.
      if (!WebPDataCopy(data, &chunk->data_)) return WEBP_MUX_MEMORY_ERROR;
      chunk->owner_ = 1;    // Chunk is owner of data.
    } else {                // Don't copy data.
      chunk->data_ = *data;
    }
  }
  chunk->tag_ = tag;
  return WEBP_MUX_OK;
}